

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O1

links_entry * insert_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  size_t __nmemb;
  size_t sVar1;
  uint uVar2;
  links_entry *plVar3;
  archive_entry *paVar4;
  links_entry **pplVar5;
  dev_t dVar6;
  size_t sVar7;
  links_entry *plVar8;
  ulong uVar9;
  links_entry **pplVar10;
  ulong uVar11;
  size_t new_size;
  
  plVar3 = (links_entry *)calloc(1,0x30);
  if (plVar3 == (links_entry *)0x0) {
    plVar3 = (links_entry *)0x0;
  }
  else {
    paVar4 = archive_entry_clone(entry);
    plVar3->canonical = paVar4;
    sVar1 = res->number_buckets;
    if ((-1 < (long)sVar1) && (__nmemb = sVar1 * 2, __nmemb < res->number_entries)) {
      pplVar5 = (links_entry **)calloc(__nmemb,8);
      if (pplVar5 != (links_entry **)0x0) {
        if (sVar1 != 0) {
          sVar7 = 0;
          do {
            plVar8 = res->buckets[sVar7];
            if (plVar8 != (links_entry *)0x0) {
              pplVar10 = res->buckets + sVar7;
              do {
                *pplVar10 = plVar8->next;
                uVar11 = plVar8->hash & __nmemb - 1;
                if (pplVar5[uVar11] != (links_entry *)0x0) {
                  pplVar5[uVar11]->previous = plVar8;
                }
                plVar8->next = pplVar5[uVar11];
                plVar8->previous = (links_entry *)0x0;
                pplVar5[uVar11] = plVar8;
                pplVar10 = res->buckets + sVar7;
                plVar8 = *pplVar10;
              } while (plVar8 != (links_entry *)0x0);
            }
            sVar7 = sVar7 + 1;
          } while (sVar7 != sVar1);
        }
        free(res->buckets);
        res->buckets = pplVar5;
        res->number_buckets = __nmemb;
      }
    }
    dVar6 = archive_entry_dev(entry);
    uVar11 = archive_entry_ino64(entry);
    pplVar5 = res->buckets;
    uVar9 = res->number_buckets - 1 & (uVar11 ^ dVar6);
    if (pplVar5[uVar9] != (links_entry *)0x0) {
      pplVar5[uVar9]->previous = plVar3;
    }
    res->number_entries = res->number_entries + 1;
    plVar3->next = pplVar5[uVar9];
    plVar3->previous = (links_entry *)0x0;
    pplVar5[uVar9] = plVar3;
    plVar3->hash = uVar11 ^ dVar6;
    uVar2 = archive_entry_nlink(entry);
    plVar3->links = uVar2 - 1;
  }
  return plVar3;
}

Assistant:

static struct links_entry *
insert_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry *le;
	size_t hash, bucket;

	/* Add this entry to the links cache. */
	le = calloc(1, sizeof(struct links_entry));
	if (le == NULL)
		return (NULL);
	le->canonical = archive_entry_clone(entry);

	/* If the links cache is getting too full, enlarge the hash table. */
	if (res->number_entries > res->number_buckets * 2)
		grow_hash(res);

	hash = (size_t)(archive_entry_dev(entry) ^ archive_entry_ino64(entry));
	bucket = hash & (res->number_buckets - 1);

	/* If we could allocate the entry, record it. */
	if (res->buckets[bucket] != NULL)
		res->buckets[bucket]->previous = le;
	res->number_entries++;
	le->next = res->buckets[bucket];
	le->previous = NULL;
	res->buckets[bucket] = le;
	le->hash = hash;
	le->links = archive_entry_nlink(entry) - 1;
	return (le);
}